

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
* __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::
doInsert<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>::DataNode<robin_hood::detail::Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>,true>>
          (pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
           *__return_storage_ptr__,
          Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          *this,DataNode<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                *keyval)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  pointer pcVar5;
  size_t __n;
  undefined8 uVar6;
  void *pvVar7;
  int iVar8;
  size_t sVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  bool bVar12;
  ulong insertion_idx;
  uint8_t *puVar13;
  NodePtr pDVar14;
  string *this_00;
  uint uVar15;
  long lVar16;
  size_type *local_60;
  size_type local_58;
  size_type local_50;
  undefined8 uStack_48;
  VariableDefinition *local_40;
  void *pvStack_38;
  
  do {
    sVar9 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
            ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                          *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)keyval);
    uVar15 = ((uint)sVar9 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar4 = *(int *)(this + 0x28);
    insertion_idx = sVar9 >> 5 & *(ulong *)(this + 0x18);
    lVar16 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar16 + insertion_idx);
    while (uVar15 = uVar15 + iVar4, uVar15 < bVar3) {
      pbVar2 = (byte *)(lVar16 + 1 + insertion_idx);
      insertion_idx = insertion_idx + 1;
      bVar3 = *pbVar2;
    }
    if (uVar15 == *(byte *)(lVar16 + insertion_idx)) {
      pcVar5 = (keyval->mData).first._M_dataplus._M_p;
      __n = (keyval->mData).first._M_string_length;
      pDVar14 = (NodePtr)(insertion_idx * 0x30 + *(long *)this);
      do {
        if ((__n == (pDVar14->mData).first._M_string_length) &&
           ((__n == 0 ||
            (iVar8 = bcmp(pcVar5,(pDVar14->mData).first._M_dataplus._M_p,__n), iVar8 == 0)))) {
          puVar13 = (uint8_t *)(lVar16 + insertion_idx);
          bVar12 = false;
          goto LAB_001fc1c8;
        }
        uVar15 = uVar15 + iVar4;
        pbVar2 = (byte *)(lVar16 + 1 + insertion_idx);
        insertion_idx = insertion_idx + 1;
        pDVar14 = pDVar14 + 1;
      } while (uVar15 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) {
      if (0xff < iVar4 + uVar15) {
        *(undefined8 *)(this + 0x20) = 0;
      }
      lVar10 = 1;
      do {
        lVar10 = lVar10 + -1;
        pcVar1 = (char *)(lVar16 + insertion_idx);
        lVar16 = lVar16 + 1;
      } while (*pcVar1 != '\0');
      this_00 = (string *)(*(long *)this + insertion_idx * 0x30);
      if (lVar10 == 0) {
        *(string **)this_00 = this_00 + 0x10;
        pcVar5 = (keyval->mData).first._M_dataplus._M_p;
        paVar11 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 == paVar11) {
          uVar6 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
          *(size_type *)(this_00 + 0x10) = paVar11->_M_allocated_capacity;
          *(undefined8 *)(this_00 + 0x18) = uVar6;
        }
        else {
          *(pointer *)this_00 = pcVar5;
          *(size_type *)(this_00 + 0x10) = paVar11->_M_allocated_capacity;
        }
        *(size_type *)(this_00 + 8) = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar11;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        pvVar7 = (keyval->mData).second.ptr;
        *(VariableDefinition **)(this_00 + 0x20) = (keyval->mData).second.definition;
        *(void **)(this_00 + 0x28) = pvVar7;
      }
      else {
        Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::shiftUp((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this,insertion_idx - lVar10,insertion_idx);
        local_60 = (size_type *)(keyval->mData).first._M_dataplus._M_p;
        paVar11 = &(keyval->mData).first.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60 == paVar11) {
          local_50 = paVar11->_M_allocated_capacity;
          uStack_48 = *(undefined8 *)((long)&(keyval->mData).first.field_2 + 8);
          local_60 = &local_50;
        }
        else {
          local_50 = paVar11->_M_allocated_capacity;
        }
        local_58 = (keyval->mData).first._M_string_length;
        (keyval->mData).first._M_dataplus._M_p = (pointer)paVar11;
        (keyval->mData).first._M_string_length = 0;
        (keyval->mData).first.field_2._M_local_buf[0] = '\0';
        local_40 = (keyval->mData).second.definition;
        pvStack_38 = (keyval->mData).second.ptr;
        std::__cxx11::string::operator=(this_00,(string *)&local_60);
        *(VariableDefinition **)(this_00 + 0x20) = local_40;
        *(void **)(this_00 + 0x28) = pvStack_38;
        if (local_60 != &local_50) {
          operator_delete(local_60,local_50 + 1);
        }
      }
      *(char *)(*(long *)(this + 8) + insertion_idx) = (char)uVar15;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      pDVar14 = (NodePtr)(insertion_idx * 0x30 + *(long *)this);
      puVar13 = (uint8_t *)(insertion_idx + *(long *)(this + 8));
      bVar12 = true;
LAB_001fc1c8:
      (__return_storage_ptr__->first).mKeyVals = pDVar14;
      (__return_storage_ptr__->first).mInfo = puVar13;
      __return_storage_ptr__->second = bVar12;
      return __return_storage_ptr__;
    }
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::increase_size((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
  } while( true );
}

Assistant:

std::pair<iterator, bool> doInsert(Arg&& keyval) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(getFirstConst(keyval), &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(getFirstConst(keyval), mKeyVals[idx].getFirst())) {
                    // key already exists, do NOT insert.
                    // see http://en.cppreference.com/w/cpp/container/unordered_map/insert
                    return std::make_pair<iterator, bool>(iterator(mKeyVals + idx, mInfo + idx),
                                                          false);
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                ::new (static_cast<void*>(&l)) Node(*this, std::forward<Arg>(keyval));
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::forward<Arg>(keyval));
            }

            // put at empty spot
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return std::make_pair(iterator(mKeyVals + insertion_idx, mInfo + insertion_idx), true);
        }
    }